

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  undefined1 *puVar1;
  char cVar2;
  curl_slist *pcVar3;
  Curl_addrinfo *pCVar4;
  char *pcVar5;
  ulong uVar6;
  size_t sVar7;
  Curl_addrinfo *pCVar8;
  void *pvVar9;
  Curl_dns_entry *pCVar10;
  uint uVar11;
  bool bVar12;
  char *__s;
  ulong in_R8;
  size_t sVar13;
  Curl_addrinfo *pCVar14;
  char *pcVar15;
  char *pcVar16;
  char address [64];
  char entry_id [262];
  Curl_addrinfo *local_1c0;
  ulong local_1b8;
  size_t local_1b0;
  char *local_1a8;
  char *local_198;
  CURLcode local_18c;
  Curl_easy *local_188;
  char *local_180;
  char local_178 [64];
  char local_138 [264];
  
  puVar1 = &(data->state).field_0x74e;
  *puVar1 = *puVar1 & 0xfb;
  pcVar3 = (data->state).resolve;
  do {
    if (pcVar3 == (curl_slist *)0x0) {
      (data->state).resolve = (curl_slist *)0x0;
      return CURLE_OK;
    }
    pcVar16 = pcVar3->data;
    if (pcVar16 == (char *)0x0) {
      uVar11 = 0;
    }
    else {
      if (*pcVar16 == '-') {
        pcVar5 = strchr(pcVar16 + 1,0x3a);
        if (pcVar5 == (char *)0x0) {
          bVar12 = true;
          sVar13 = 0;
          uVar6 = 0;
        }
        else {
          uVar6 = strtoul(pcVar5 + 1,(char **)0x0,10);
          sVar13 = (long)pcVar5 - (long)(pcVar16 + 1);
          bVar12 = 0xffff < uVar6 || sVar13 == 0;
        }
        if (bVar12) {
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
            Curl_infof(data,"Bad syntax CURLOPT_RESOLVE removal entry \'%s\'",pcVar3->data);
          }
        }
        else {
          sVar13 = create_hostcache_id(pcVar3->data + 1,sVar13,(int)uVar6,local_138,in_R8);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
          }
          Curl_hash_delete((data->dns).hostcache,local_138,sVar13 + 1);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
          }
        }
        uVar11 = 0;
        if (bVar12) goto LAB_0071ca1d;
      }
      else {
        cVar2 = *pcVar3->data;
        pcVar16 = pcVar3->data + (cVar2 == '+');
        pcVar5 = strchr(pcVar16,0x3a);
        bVar12 = true;
        if (pcVar5 == (char *)0x0) {
          local_1c0 = (Curl_addrinfo *)0x0;
          local_1a8 = (char *)0x0;
          local_1b8 = 0;
          local_1b0 = 0;
        }
        else {
          local_1b0 = (long)pcVar5 - (long)pcVar16;
          local_1b8 = strtoul(pcVar5 + 1,&local_198,10);
          if (((local_1b8 < 0x10000) && (local_198 != pcVar5 + 1)) && (*local_198 == ':')) {
            local_1a8 = local_198 + 1;
            local_188 = data;
            local_180 = pcVar16;
            if (*local_198 == '\0') {
              local_1c0 = (Curl_addrinfo *)0x0;
              pcVar5 = local_198;
            }
            else {
              local_1c0 = (Curl_addrinfo *)0x0;
              pcVar16 = local_198;
              pCVar14 = (Curl_addrinfo *)0x0;
              do {
                __s = pcVar16 + 1;
                pcVar5 = strchr(__s,0x2c);
                if (pcVar5 == (char *)0x0) {
                  sVar7 = strlen(__s);
                  pcVar5 = __s + sVar7;
                }
                pcVar15 = pcVar5;
                pCVar8 = pCVar14;
                pCVar4 = local_1c0;
                if (*__s == '[') {
                  uVar11 = 7;
                  if ((pcVar5 != __s) && (pcVar5[-1] == ']')) {
                    __s = pcVar16 + 2;
                    pcVar15 = pcVar5 + -1;
                    goto LAB_0071c89d;
                  }
                }
                else {
LAB_0071c89d:
                  uVar6 = (long)pcVar15 - (long)__s;
                  if (uVar6 == 0) {
                    uVar11 = 8;
                  }
                  else {
                    uVar11 = 7;
                    if (uVar6 < 0x40) {
                      memcpy(local_178,__s,uVar6);
                      local_178[uVar6] = '\0';
                      pCVar8 = Curl_str2addr(local_178,(int)local_1b8);
                      if (pCVar8 == (Curl_addrinfo *)0x0) {
                        pCVar8 = pCVar14;
                        if ((local_188 != (Curl_easy *)0x0) &&
                           (((local_188->set).field_0x8bd & 0x10) != 0)) {
                          Curl_infof(local_188,"Resolve address \'%s\' found illegal",local_178);
                        }
                      }
                      else {
                        uVar11 = 0;
                        pCVar4 = pCVar8;
                        if (pCVar14 != (Curl_addrinfo *)0x0) {
                          pCVar14->ai_next = pCVar8;
                          pCVar4 = local_1c0;
                        }
                      }
                    }
                  }
                }
                local_1c0 = pCVar4;
                if ((uVar11 != 0) && (uVar11 != 8)) {
                  data = local_188;
                  pcVar16 = local_180;
                  local_198 = pcVar5;
                  if (uVar11 != 7) goto LAB_0071cc22;
                  goto LAB_0071ca5d;
                }
                pcVar16 = pcVar5;
                pCVar14 = pCVar8;
              } while (*pcVar5 != '\0');
            }
            bVar12 = local_1c0 == (Curl_addrinfo *)0x0;
            data = local_188;
            pcVar16 = local_180;
            local_198 = pcVar5;
          }
          else {
            local_1c0 = (Curl_addrinfo *)0x0;
            local_1a8 = (char *)0x0;
            local_1b8 = 0;
          }
        }
LAB_0071ca5d:
        if (bVar12) {
          Curl_failf(data,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'",pcVar3->data);
          Curl_freeaddrinfo(local_1c0);
          local_18c = CURLE_SETOPT_OPTION_SYNTAX;
LAB_0071cc1d:
          uVar11 = 1;
        }
        else {
          sVar13 = create_hostcache_id(pcVar16,local_1b0,(int)local_1b8,local_138,in_R8);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
          }
          pvVar9 = Curl_hash_pick((data->dns).hostcache,local_138,sVar13 + 1);
          if (pvVar9 != (void *)0x0) {
            if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
              Curl_infof(data,"RESOLVE %.*s:%d - old addresses discarded",local_1b0,pcVar16,
                         local_1b8);
            }
            Curl_hash_delete((data->dns).hostcache,local_138,sVar13 + 1);
          }
          in_R8 = local_1b8;
          pCVar10 = Curl_cache_addr(data,local_1c0,pcVar16,local_1b0,(int)local_1b8);
          if (pCVar10 != (Curl_dns_entry *)0x0) {
            if (cVar2 != '+') {
              pCVar10->timestamp = 0;
            }
            pCVar10->inuse = pCVar10->inuse + -1;
          }
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
          }
          if (pCVar10 == (Curl_dns_entry *)0x0) {
            Curl_freeaddrinfo(local_1c0);
            local_18c = CURLE_OUT_OF_MEMORY;
            goto LAB_0071cc1d;
          }
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
            pcVar5 = "";
            if (cVar2 == '+') {
              pcVar5 = " (non-permanent)";
            }
            in_R8 = local_1b8;
            Curl_infof(data,"Added %.*s:%d:%s to DNS cache%s",local_1b0,pcVar16,local_1b8,local_1a8,
                       pcVar5);
          }
          uVar11 = 0;
          if ((local_1b0 == 1) && (*pcVar16 == '*')) {
            if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
              Curl_infof(data,"RESOLVE *:%d using wildcard",local_1b8);
            }
            puVar1 = &(data->state).field_0x74e;
            *puVar1 = *puVar1 | 4;
          }
        }
LAB_0071cc22:
        if (uVar11 != 0) goto LAB_0071ca1d;
      }
      uVar11 = 0;
    }
LAB_0071ca1d:
    if ((uVar11 & 0xb) != 0) {
      return local_18c;
    }
    pcVar3 = pcVar3->next;
  } while( true );
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct curl_slist *hostp;
  char *host_end;

  /* Default is no wildcard found */
  data->state.wildcard_resolve = false;

  for(hostp = data->state.resolve; hostp; hostp = hostp->next) {
    char entry_id[MAX_HOSTCACHE_LEN];
    if(!hostp->data)
      continue;
    if(hostp->data[0] == '-') {
      unsigned long num = 0;
      size_t entry_len;
      size_t hlen = 0;
      host_end = strchr(&hostp->data[1], ':');

      if(host_end) {
        hlen = host_end - &hostp->data[1];
        num = strtoul(++host_end, NULL, 10);
        if(!hlen || (num > 0xffff))
          host_end = NULL;
      }
      if(!host_end) {
        infof(data, "Bad syntax CURLOPT_RESOLVE removal entry '%s'",
              hostp->data);
        continue;
      }
      /* Create an entry id, based upon the hostname and port */
      entry_len = create_hostcache_id(&hostp->data[1], hlen, (int)num,
                                      entry_id, sizeof(entry_id));
      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* delete entry, ignore if it didn't exist */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);
    }
    else {
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *head = NULL, *tail = NULL;
      size_t entry_len;
      char address[64];
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      char *addresses = NULL;
#endif
      char *addr_begin;
      char *addr_end;
      char *port_ptr;
      int port = 0;
      char *end_ptr;
      bool permanent = TRUE;
      unsigned long tmp_port;
      bool error = true;
      char *host_begin = hostp->data;
      size_t hlen = 0;

      if(host_begin[0] == '+') {
        host_begin++;
        permanent = FALSE;
      }
      host_end = strchr(host_begin, ':');
      if(!host_end)
        goto err;
      hlen = host_end - host_begin;

      port_ptr = host_end + 1;
      tmp_port = strtoul(port_ptr, &end_ptr, 10);
      if(tmp_port > USHRT_MAX || end_ptr == port_ptr || *end_ptr != ':')
        goto err;

      port = (int)tmp_port;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      addresses = end_ptr + 1;
#endif

      while(*end_ptr) {
        size_t alen;
        struct Curl_addrinfo *ai;

        addr_begin = end_ptr + 1;
        addr_end = strchr(addr_begin, ',');
        if(!addr_end)
          addr_end = addr_begin + strlen(addr_begin);
        end_ptr = addr_end;

        /* allow IP(v6) address within [brackets] */
        if(*addr_begin == '[') {
          if(addr_end == addr_begin || *(addr_end - 1) != ']')
            goto err;
          ++addr_begin;
          --addr_end;
        }

        alen = addr_end - addr_begin;
        if(!alen)
          continue;

        if(alen >= sizeof(address))
          goto err;

        memcpy(address, addr_begin, alen);
        address[alen] = '\0';

#ifndef ENABLE_IPV6
        if(strchr(address, ':')) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.",
                address);
          continue;
        }
#endif

        ai = Curl_str2addr(address, port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
      }

      if(!head)
        goto err;

      error = false;
err:
      if(error) {
        failf(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'",
              hostp->data);
        Curl_freeaddrinfo(head);
        return CURLE_SETOPT_OPTION_SYNTAX;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_len = create_hostcache_id(host_begin, hlen, port,
                                      entry_id, sizeof(entry_id));

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* See if it's already in our dns cache */
      dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

      if(dns) {
        infof(data, "RESOLVE %.*s:%d - old addresses discarded",
              (int)hlen, host_begin, port);
        /* delete old entry, there are two reasons for this
         1. old entry may have different addresses.
         2. even if entry with correct addresses is already in the cache,
            but if it is close to expire, then by the time next http
            request is made, it can get expired and pruned because old
            entry is not necessarily marked as permanent.
         3. when adding a non-permanent entry, we want it to remove and
            replace an existing permanent entry.
         4. when adding a non-permanent entry, we want it to get a "fresh"
            timeout that starts _now_. */

        Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
      }

      /* put this new host in the cache */
      dns = Curl_cache_addr(data, head, host_begin, hlen, port);
      if(dns) {
        if(permanent)
          dns->timestamp = 0; /* mark as permanent */
        /* release the returned reference; the cache itself will keep the
         * entry alive: */
        dns->inuse--;
      }

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        Curl_freeaddrinfo(head);
        return CURLE_OUT_OF_MEMORY;
      }
#ifndef CURL_DISABLE_VERBOSE_STRINGS
      infof(data, "Added %.*s:%d:%s to DNS cache%s",
            (int)hlen, host_begin, port, addresses,
            permanent ? "" : " (non-permanent)");
#endif

      /* Wildcard hostname */
      if((hlen == 1) && (host_begin[0] == '*')) {
        infof(data, "RESOLVE *:%d using wildcard", port);
        data->state.wildcard_resolve = true;
      }
    }
  }
  data->state.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}